

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-magic.c
# Opt level: O2

wchar_t borg_get_spell_number(borg_spells spell)

{
  wchar_t wVar1;
  borg_spells *pbVar2;
  ulong uVar3;
  ulong uVar4;
  
  if (borg_magics != (borg_magic *)0x0) {
    wVar1 = (player->class->magic).total_spells;
    uVar3 = 0;
    uVar4 = (ulong)(uint)wVar1;
    if (wVar1 < L'\x01') {
      uVar4 = uVar3;
    }
    pbVar2 = &borg_magics->spell_enum;
    for (; uVar4 != uVar3; uVar3 = uVar3 + 1) {
      if (*pbVar2 == spell) {
        return (wchar_t)uVar3;
      }
      pbVar2 = pbVar2 + 8;
    }
  }
  return L'\xffffffff';
}

Assistant:

static int borg_get_spell_number(const enum borg_spells spell)
{
    /* The borg must be able to "cast" spells */
    if (borg_magics == NULL)
        return -1;

    int total_spells = player->class->magic.total_spells;
    for (int spell_num = 0; spell_num < total_spells; spell_num++) {
        if (borg_magics[spell_num].spell_enum == spell)
            return spell_num;
    }

    return -1;
}